

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpleformatter.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::SimpleFormatter::formatAndAppend
          (SimpleFormatter *this,UnicodeString **values,int32_t valuesLength,UnicodeString *appendTo
          ,int32_t *offsets,int32_t offsetsLength,UErrorCode *errorCode)

{
  ushort uVar1;
  int32_t compiledPatternLength;
  char16_t *pcVar2;
  uint uVar3;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((-1 < valuesLength) && (values != (UnicodeString **)0x0 || valuesLength == 0)) {
      if ((-1 < offsetsLength) && (offsets != (int32_t *)0x0 || offsetsLength == 0)) {
        uVar1 = (this->compiledPattern).fUnion.fStackFields.fLengthAndFlags;
        if ((uVar1 & 0x11) == 0) {
          if ((uVar1 & 2) == 0) {
            pcVar2 = (this->compiledPattern).fUnion.fFields.fArray;
          }
          else {
            pcVar2 = (this->compiledPattern).fUnion.fStackFields.fBuffer;
          }
        }
        else {
          pcVar2 = (char16_t *)0x0;
        }
        if ((short)uVar1 < 0) {
          compiledPatternLength = (this->compiledPattern).fUnion.fFields.fLength;
        }
        else {
          compiledPatternLength = (int)(short)uVar1 >> 5;
        }
        if (compiledPatternLength == 0) {
          uVar3 = 0;
        }
        else {
          uVar3 = (uint)(ushort)*pcVar2;
        }
        if (uVar3 <= (uint)valuesLength) {
          if ((uVar1 & 0x11) == 0) {
            if ((uVar1 & 2) == 0) {
              pcVar2 = (this->compiledPattern).fUnion.fFields.fArray;
            }
            else {
              pcVar2 = (this->compiledPattern).fUnion.fStackFields.fBuffer;
            }
          }
          else {
            pcVar2 = (char16_t *)0x0;
          }
          format(pcVar2,compiledPatternLength,values,appendTo,(UnicodeString *)0x0,'\x01',offsets,
                 offsetsLength,errorCode);
          return appendTo;
        }
      }
    }
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return appendTo;
}

Assistant:

UnicodeString& SimpleFormatter::formatAndAppend(
        const UnicodeString *const *values, int32_t valuesLength,
        UnicodeString &appendTo,
        int32_t *offsets, int32_t offsetsLength, UErrorCode &errorCode) const {
    if (U_FAILURE(errorCode)) {
        return appendTo;
    }
    if (isInvalidArray(values, valuesLength) || isInvalidArray(offsets, offsetsLength) ||
            valuesLength < getArgumentLimit()) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return appendTo;
    }
    return format(compiledPattern.getBuffer(), compiledPattern.length(), values,
                  appendTo, NULL, TRUE,
                  offsets, offsetsLength, errorCode);
}